

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::BufferData::BufferData
          (BufferData *this,SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *buffer,GLenum target,
          GLsizeiptr size,GLenum usage,bool useSync,bool serverSync)

{
  Buffer *pBVar1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_40;
  
  Operation::Operation(&this->super_Operation,"BufferData",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation = (_func_int **)&PTR__BufferData_01e084c8;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::SharedPtr(&this->m_buffer,buffer);
  this->m_target = target;
  this->m_size = size;
  this->m_usage = usage;
  local_40.m_ptr = &((this->m_buffer).m_ptr)->super_Object;
  local_40.m_state = (this->m_buffer).m_state;
  if (local_40.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_40.m_state)->strongRefCount = (local_40.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_40.m_state)->weakRefCount = (local_40.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_40);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::release(&local_40);
  pBVar1 = buffer->m_ptr;
  pBVar1->isDefined = true;
  pBVar1->size = size;
  return;
}

Assistant:

BufferData::BufferData (SharedPtr<Buffer> buffer, GLenum target, GLsizeiptr size, GLenum usage, bool useSync, bool serverSync)
	: Operation	("BufferData", useSync, serverSync)
	, m_buffer	(buffer)
	, m_target	(target)
	, m_size	(size)
	, m_usage	(usage)
{
	modifyGLObject(SharedPtr<Object>(m_buffer));
	buffer->isDefined	= true;
	buffer->size		= size;
}